

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Histogram(HistogramForm1 Histogram)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint width;
  uint32_t uVar1;
  uint32_t uVar2;
  size_type sVar3;
  const_reference pvVar4;
  code *in_RDI;
  byte bVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image image;
  uint8_t intensity;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined2 uVar6;
  uint8_t in_stack_ffffffffffffff36;
  undefined1 uVar7;
  uint8_t in_stack_ffffffffffffff37;
  undefined1 uVar8;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  value_type vVar9;
  uint32_t in_stack_ffffffffffffff54;
  uint8_t value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88 [3];
  ImageTemplate<unsigned_char> local_38;
  byte local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  width = (uint)local_9;
  value = '\0';
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff37,in_stack_ffffffffffffff36
            );
  Test_Helper::uniformImage
            (value,width,in_stack_ffffffffffffff54,
             (Image *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d6b5f);
  (*local_8)(local_88,&local_38);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
  bVar5 = false;
  if (sVar3 == 0x100) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_88,(ulong)local_9);
    vVar9 = *pvVar4;
    uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    bVar5 = false;
    if (vVar9 == uVar1 * uVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      __first._M_current._4_2_ = in_stack_ffffffffffffff34;
      __first._M_current._0_4_ = in_stack_ffffffffffffff30;
      __first._M_current._6_1_ = in_stack_ffffffffffffff36;
      __first._M_current._7_1_ = in_stack_ffffffffffffff37;
      __last._M_current._7_1_ = in_stack_ffffffffffffff2f;
      __last._M_current._0_7_ = in_stack_ffffffffffffff28;
      in_stack_ffffffffffffff44 =
           std::
           accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                     (__first,__last,0);
      uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
      uVar6 = (undefined2)uVar1;
      uVar7 = (undefined1)(uVar1 >> 0x10);
      uVar8 = (undefined1)(uVar1 >> 0x18);
      uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
      bVar5 = in_stack_ffffffffffffff44 == CONCAT13(uVar8,CONCAT12(uVar7,uVar6)) * uVar1;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d6c88);
  return (bool)(bVar5 & 1);
}

Assistant:

bool form1_Histogram(HistogramForm1 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const std::vector < uint32_t > histogram = Histogram( image );

        return histogram.size() == 256u && histogram[intensity] == image.width() * image.height() &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == image.width() * image.height();
    }